

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

GCstr * lj_ctype_repr_complex(lua_State *L,void *sp,CTSize size)

{
  ulong uVar1;
  SBuf *sb_00;
  GCstr *pGVar2;
  int in_EDX;
  float *in_RSI;
  long in_RDI;
  SBuf *sb_01;
  double dVar3;
  TValue im;
  TValue re;
  SBuf *sb;
  undefined4 in_stack_00000018;
  SBuf *sb_1;
  
  uVar1 = (ulong)*(uint *)(in_RDI + 8);
  sb_00 = (SBuf *)(uVar1 + 0xe8);
  *(int *)(uVar1 + 0xf4) = (int)in_RDI;
  (sb_00->p).ptr32 = *(uint32_t *)(uVar1 + 0xf0);
  if (in_EDX == 0x10) {
    sb_01 = *(SBuf **)in_RSI;
    dVar3 = *(double *)(in_RSI + 2);
  }
  else {
    sb_01 = (SBuf *)(double)*in_RSI;
    dVar3 = (double)in_RSI[1];
  }
  lj_strfmt_putfnum(sb_01,(SFormat)((ulong)dVar3 >> 0x20),9.0876755072843e-318);
  if ((((ulong)dVar3 & 0x8000000000000000) == 0) || (NAN(dVar3))) {
    lj_buf_putchar(sb_00,(int)((ulong)sb_01 >> 0x20));
  }
  lj_strfmt_putfnum(sb_01,(SFormat)((ulong)dVar3 >> 0x20),9.0879966499541e-318);
  lj_buf_putchar(sb_00,(int)((ulong)sb_01 >> 0x20));
  pGVar2 = lj_str_new((lua_State *)sp,(char *)CONCAT44(size,in_stack_00000018),(size_t)sb);
  return pGVar2;
}

Assistant:

GCstr *lj_ctype_repr_complex(lua_State *L, void *sp, CTSize size)
{
  SBuf *sb = lj_buf_tmp_(L);
  TValue re, im;
  if (size == 2*sizeof(double)) {
    re.n = *(double *)sp; im.n = ((double *)sp)[1];
  } else {
    re.n = (double)*(float *)sp; im.n = (double)((float *)sp)[1];
  }
  lj_strfmt_putfnum(sb, STRFMT_G14, re.n);
  if (!(im.u32.hi & 0x80000000u) || im.n != im.n) lj_buf_putchar(sb, '+');
  lj_strfmt_putfnum(sb, STRFMT_G14, im.n);
  lj_buf_putchar(sb, sbufP(sb)[-1] >= 'a' ? 'I' : 'i');
  return lj_buf_str(L, sb);
}